

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

int Io_ReadPlaMergeDistance1(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong *puVar1;
  word *pwVar2;
  word *pwVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int local_54;
  
  Vec_BitFill(vMarks,nCubes,nWords);
  uVar12 = 0;
  uVar13 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar13 = uVar12;
  }
  uVar8 = 0;
  if (0 < nCubes) {
    uVar8 = (ulong)(uint)nCubes;
  }
  local_54 = 0;
  do {
    if (uVar12 == uVar8) {
      return local_54;
    }
    iVar6 = Vec_BitEntry(vMarks,(int)uVar12);
    uVar10 = uVar12;
    if (iVar6 == 0) {
LAB_0029a372:
      do {
        do {
          uVar9 = uVar10;
          uVar10 = uVar9 + 1;
          iVar6 = (int)uVar10;
          if (nCubes <= iVar6) goto LAB_0029a403;
          iVar7 = Vec_BitEntry(vMarks,iVar6);
        } while (iVar7 != 0);
        pwVar2 = pCs[uVar12];
        pwVar3 = pCs[uVar9 + 1];
        bVar5 = false;
        for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          uVar4 = pwVar2[uVar9];
          uVar11 = pwVar3[uVar9];
          if ((uVar4 != uVar11) &&
             ((bVar5 || (uVar11 = uVar11 ^ uVar4,
                        uVar11 = (uVar11 >> 1 | uVar11) & 0x5555555555555555, uVar4 = uVar11 - 1,
                        bVar5 = true, (uVar11 ^ uVar4) <= uVar4)))) goto LAB_0029a372;
        }
      } while (!bVar5);
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        puVar1 = pwVar2 + uVar10;
        *puVar1 = *puVar1 & pwVar3[uVar10];
      }
      Vec_BitWriteEntry(vMarks,iVar6,(int)uVar10);
      local_54 = local_54 + 1;
    }
LAB_0029a403:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

int Io_ReadPlaMergeDistance1( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaDistance1( pCs[c1], pCs[c2], nWords );
                    if ( !Res )
                        continue;
                    Abc_TtAnd( pCs[c1], pCs[c1], pCs[c2], nWords, 0 );
                    Vec_BitWriteEntry( vMarks, c2, 1 );
                    Counter++;
                    break;
                }
    return Counter;
}